

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.cpp
# Opt level: O2

void boost::deflate::easy_test::test_compress(void)

{
  runner *prVar1;
  wrap in_R8B;
  wrap wVar2;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  prVar1 = test_suite::detail::current()::p;
  easy_compress_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38,(deflate *)0x11a923,(string_view)ZEXT816(0),in_R8B);
  wVar2 = 0x15;
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_38,"easy_compress(\"\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x15,"static void boost::deflate::easy_test::test_compress()",(char *)0x0);
  optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_38);
  prVar1 = test_suite::detail::current()::p;
  easy_compress_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_60,(deflate *)"aaaaaaaaaaaaaaa",(string_view)ZEXT816(0xf),wVar2);
  wVar2 = 0x16;
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60,"easy_compress(\"aaaaaaaaaaaaaaa\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x16,"static void boost::deflate::easy_test::test_compress()",(char *)0x0);
  optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_60);
  prVar1 = test_suite::detail::current()::p;
  easy_compress_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88,(deflate *)"This is a test string",(string_view)ZEXT816(0x15),wVar2);
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_88,"easy_compress(\"This is a test string\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x17,"static void boost::deflate::easy_test::test_compress()",(char *)0x0);
  optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&local_88);
  return;
}

Assistant:

static void test_compress() {
      BOOST_TEST(easy_compress(""));
      BOOST_TEST(easy_compress("aaaaaaaaaaaaaaa"));
      BOOST_TEST(easy_compress("This is a test string"));
  }